

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acb.h
# Opt level: O2

int * Acb_ObjFanins(Acb_Ntk_t *p,int i)

{
  uint uVar1;
  
  if (i < 1) {
    __assert_fail("i>0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/acb/acb.h"
                  ,0xfe,"int Acb_ObjFanOffset(Acb_Ntk_t *, int)");
  }
  uVar1 = Vec_IntEntry(&p->vObjFans,i);
  if ((-1 < (int)uVar1) && ((int)uVar1 < (p->vFanSto).nSize)) {
    return (p->vFanSto).pArray + uVar1;
  }
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                ,0x1ba,"int *Vec_IntEntryP(Vec_Int_t *, int)");
}

Assistant:

static inline int            Acb_ObjFanOffset( Acb_Ntk_t * p, int i )                { assert(i>0); return Vec_IntEntry(&p->vObjFans, i);                                                   }